

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O2

void fillInSwapArray(permInfo *pi)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  swapInfo *x;
  varInfo *pvVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  
  iVar3 = pi->totalSwaps;
  uVar1 = pi->varN;
  lVar7 = (long)(int)uVar1;
  x = (swapInfo *)malloc(0x20);
  pvVar4 = (varInfo *)malloc(lVar7 * 8 + 0x10);
  x->posArray = pvVar4;
  piVar5 = (int *)malloc(lVar7 * 4 + 8);
  x->realArray = piVar5;
  x->varN = uVar1;
  *piVar5 = uVar1 + 100;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  for (lVar6 = 1; lVar6 - (ulong)uVar2 != 1; lVar6 = lVar6 + 1) {
    pvVar4[lVar6].position = (int)lVar6;
    pvVar4[lVar6].direction = -1;
    piVar5[lVar6] = (int)lVar6;
  }
  piVar5[lVar7 + 1] = uVar1 + 10;
  lVar7 = (long)iVar3 * 4;
  while( true ) {
    lVar7 = lVar7 + -4;
    iVar3 = nextSwap(x);
    if (iVar3 == 0) break;
    iVar3 = x->positionToSwap2;
    if (x->positionToSwap1 < x->positionToSwap2) {
      iVar3 = x->positionToSwap1;
    }
    *(int *)((long)pi->swapArray + lVar7) = iVar3;
  }
  free(x->posArray);
  free(x->realArray);
  free(x);
  return;
}

Assistant:

void fillInSwapArray(permInfo* pi)
{
    int counter=pi->totalSwaps-1;
    swapInfo* x= setSwapInfoPtr(pi->varN);
    while(nextSwap(x)==1)
    {
        if(x->positionToSwap1<x->positionToSwap2)
            pi->swapArray[counter--]=x->positionToSwap1;
        else
            pi->swapArray[counter--]=x->positionToSwap2;
    }
    
    freeSwapInfoPtr(x);    
}